

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example.cc
# Opt level: O2

void __thiscall TC_parser<true>::maybeFeature(TC_parser<true> *this)

{
  v_array<char> *pvVar1;
  char **ppcVar2;
  float fVar3;
  char cVar4;
  byte bVar5;
  size_t sVar6;
  example *peVar7;
  v_hashmap<substring,_features_*> *this_00;
  features *pfVar8;
  unsigned_long *_begin;
  substring s;
  feature_index i;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ppVar9;
  uint64_t uVar10;
  pointer ppvVar11;
  features **ppfVar12;
  ostream *poVar13;
  pointer ppvVar14;
  float *pfVar15;
  char *pcVar16;
  float *_begin_00;
  uint uVar17;
  ulong uVar18;
  char *pcVar19;
  size_t num;
  uint64_t uVar20;
  char *pcVar21;
  float fVar22;
  substring sVar23;
  substring feature_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_1d8;
  features *local_1d0;
  __shared_ptr<std::pair<std::__cxx11::string,std::__cxx11::string>,(__gnu_cxx::_Lock_policy)2>
  local_1c8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1c0;
  v_array<char> feature_v;
  
  cVar4 = *this->reading_head;
  if ((((cVar4 != '\t') && (cVar4 != ' ')) && (cVar4 != '|')) &&
     ((cVar4 != '\r' && (this->reading_head != this->endLine)))) {
    sVar23 = read_name(this);
    fVar3 = this->cur_channel_v;
    feature_name = sVar23;
    fVar22 = featureValue(this);
    fVar22 = fVar22 * fVar3;
    this->v = fVar22;
    num = (long)sVar23.end - (long)sVar23.begin;
    if (num == 0) {
      sVar6 = this->anon;
      this->anon = sVar6 + 1;
      i = sVar6 + this->channel_hash;
    }
    else {
      i = (*this->p->hasher)(sVar23,this->channel_hash);
      fVar22 = this->v;
    }
    if ((fVar22 != 0.0) || (NAN(fVar22))) {
      peVar7 = this->ae;
      bVar5 = this->index;
      features::push_back((peVar7->super_example_predict).feature_space + bVar5,fVar22,i);
      feature_v.end_array = (char *)0x0;
      feature_v.erase_count = 0;
      feature_v._begin = (char *)0x0;
      feature_v._end = (char *)0x0;
      push_many<char>(&feature_v,sVar23.begin,num);
      local_1f8._M_dataplus._M_p._0_1_ = 0;
      v_array<char>::push_back(&feature_v,(char *)&local_1f8);
      ppVar9 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)operator_new(0x40);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<char_*&,_char_*&,_true>(ppVar9,&this->base,&feature_v._begin);
      std::
      __shared_ptr<std::pair<std::__cxx11::string,std::__cxx11::string>,(__gnu_cxx::_Lock_policy)2>
      ::__shared_ptr<std::pair<std::__cxx11::string,std::__cxx11::string>,void>
                ((__shared_ptr<std::pair<std::__cxx11::string,std::__cxx11::string>,(__gnu_cxx::_Lock_policy)2>
                  *)&local_1f8,ppVar9);
      v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::push_back(&(peVar7->super_example_predict).feature_space[bVar5].space_names,
                  (shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_1f8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_1f8._M_string_length);
      v_array<char>::delete_v(&feature_v);
      uVar18 = (ulong)this->index;
      uVar20 = this->affix_features[uVar18];
      if (uVar20 != 0) {
        if (feature_name.end != feature_name.begin) {
          peVar7 = this->ae;
          if ((peVar7->super_example_predict).feature_space[0x84].values._end ==
              (peVar7->super_example_predict).feature_space[0x84].values._begin) {
            v_array<unsigned_char>::push_back((v_array<unsigned_char> *)peVar7,&affix_namespace);
            uVar20 = this->affix_features[this->index];
          }
          local_1d0 = (peVar7->super_example_predict).feature_space + 0x84;
          local_1d8 = &(peVar7->super_example_predict).feature_space[0x84].space_names;
          for (; uVar20 != 0; uVar20 = uVar20 >> 4) {
            uVar17 = (uint)(uVar20 >> 1) & 7;
            pcVar19 = feature_name.begin + uVar17;
            pcVar16 = feature_name.end + -(ulong)uVar17;
            if (feature_name.end <= pcVar19) {
              pcVar16 = feature_name.begin;
            }
            pcVar21 = feature_name.end;
            if ((uVar20 & 1) != 0) {
              pcVar21 = pcVar19;
              pcVar16 = feature_name.begin;
            }
            if (feature_name.end <= pcVar19) {
              pcVar21 = feature_name.end;
            }
            sVar23.end = pcVar21;
            sVar23.begin = pcVar16;
            uVar10 = (*this->p->hasher)(sVar23,this->channel_hash);
            features::push_back(local_1d0,this->v,
                                ((ulong)((uint)uVar20 & 0xf) * 0x1aa5cfd + 0xd42855) * uVar10);
            feature_v.end_array = (char *)0x0;
            feature_v.erase_count = 0;
            feature_v._begin = (char *)0x0;
            feature_v._end = (char *)0x0;
            local_1f8._M_dataplus._M_p._0_1_ = this->index;
            if ((byte)local_1f8._M_dataplus._M_p != ' ') {
              v_array<char>::push_back(&feature_v,(char *)&local_1f8);
            }
            local_1f8._M_dataplus._M_p._0_1_ = ((uVar20 & 1) == 0) * '\x02' + '+';
            v_array<char>::push_back(&feature_v,(char *)&local_1f8);
            local_1f8._M_dataplus._M_p._0_1_ = (byte)uVar17 | 0x30;
            v_array<char>::push_back(&feature_v,(char *)&local_1f8);
            local_1f8._M_dataplus._M_p._0_1_ = 0x3d;
            v_array<char>::push_back(&feature_v,(char *)&local_1f8);
            push_many<char>(&feature_v,pcVar16,(long)pcVar21 - (long)pcVar16);
            local_1f8._M_dataplus._M_p._0_1_ = 0;
            v_array<char>::push_back(&feature_v,(char *)&local_1f8);
            ppVar9 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)operator_new(0x40);
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::pair<const_char_(&)[6],_char_*&,_true>(ppVar9,(char (*) [6])"affix",&feature_v._begin)
            ;
            std::
            __shared_ptr<std::pair<std::__cxx11::string,std::__cxx11::string>,(__gnu_cxx::_Lock_policy)2>
            ::__shared_ptr<std::pair<std::__cxx11::string,std::__cxx11::string>,void>
                      ((__shared_ptr<std::pair<std::__cxx11::string,std::__cxx11::string>,(__gnu_cxx::_Lock_policy)2>
                        *)&local_1f8,ppVar9);
            v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::push_back(local_1d8,
                        (shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&local_1f8);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_1f8._M_string_length);
          }
          uVar18 = (ulong)this->index;
        }
      }
      if (this->spelling_features[uVar18] == true) {
        peVar7 = this->ae;
        if ((peVar7->super_example_predict).feature_space[0x85].values._end ==
            (peVar7->super_example_predict).feature_space[0x85].values._begin) {
          v_array<unsigned_char>::push_back((v_array<unsigned_char> *)peVar7,&spelling_namespace);
        }
        v_array<char>::clear(&this->spelling);
        for (pcVar19 = feature_name.begin; pcVar19 != feature_name.end; pcVar19 = pcVar19 + 1) {
          cVar4 = *pcVar19;
          if ((byte)(cVar4 - 0x30U) < 10) {
            feature_v._begin = (char *)CONCAT71(feature_v._begin._1_7_,0x30);
          }
          else if ((byte)(cVar4 + 0x9fU) < 0x1a) {
            feature_v._begin = (char *)CONCAT71(feature_v._begin._1_7_,0x61);
          }
          else if ((byte)(cVar4 + 0xbfU) < 0x1a) {
            feature_v._begin = (char *)CONCAT71(feature_v._begin._1_7_,0x41);
          }
          else if (cVar4 == '.') {
            feature_v._begin = (char *)CONCAT71(feature_v._begin._1_7_,0x2e);
          }
          else {
            feature_v._begin = (char *)CONCAT71(feature_v._begin._1_7_,0x23);
          }
          v_array<char>::push_back(&this->spelling,(char *)&feature_v);
        }
        pvVar1 = &this->spelling;
        pcVar19 = pvVar1->_begin;
        pcVar16 = (this->spelling)._end;
        s.begin = pvVar1->_begin;
        s.end = pvVar1->_end;
        uVar20 = hashstring(s,this->channel_hash);
        features::push_back((peVar7->super_example_predict).feature_space + 0x85,this->v,uVar20);
        feature_v.end_array = (char *)0x0;
        feature_v.erase_count = 0;
        feature_v._begin = (char *)0x0;
        feature_v._end = (char *)0x0;
        if (this->index != ' ') {
          local_1f8._M_dataplus._M_p._0_1_ = this->index;
          v_array<char>::push_back(&feature_v,(char *)&local_1f8);
          local_1f8._M_dataplus._M_p._0_1_ = 0x5f;
          v_array<char>::push_back(&feature_v,(char *)&local_1f8);
        }
        push_many<char>(&feature_v,pcVar19,(long)pcVar16 - (long)pcVar19);
        local_1f8._M_dataplus._M_p._0_1_ = 0;
        v_array<char>::push_back(&feature_v,(char *)&local_1f8);
        ppVar9 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)operator_new(0x40);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[9],_char_*&,_true>(ppVar9,(char (*) [9])"spelling",&feature_v._begin);
        std::
        __shared_ptr<std::pair<std::__cxx11::string,std::__cxx11::string>,(__gnu_cxx::_Lock_policy)2>
        ::__shared_ptr<std::pair<std::__cxx11::string,std::__cxx11::string>,void>
                  ((__shared_ptr<std::pair<std::__cxx11::string,std::__cxx11::string>,(__gnu_cxx::_Lock_policy)2>
                    *)&local_1f8,ppVar9);
        v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::push_back(&(peVar7->super_example_predict).feature_space[0x85].space_names,
                    (shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_1f8);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_1f8._M_string_length);
        uVar18 = (ulong)this->index;
      }
      ppvVar11 = this->namespace_dictionaries[uVar18].
                 super__Vector_base<v_hashmap<substring,_features_*>_*,_std::allocator<v_hashmap<substring,_features_*>_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppvVar14 = this->namespace_dictionaries[uVar18].
                 super__Vector_base<v_hashmap<substring,_features_*>_*,_std::allocator<v_hashmap<substring,_features_*>_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      if (ppvVar14 != ppvVar11) {
        ppcVar2 = &feature_v.end_array;
        for (local_1d8 = (v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)0x0; local_1d8 < (ulong)((long)ppvVar14 - (long)ppvVar11 >> 3);
            local_1d8 = (v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)((long)local_1d8 + 1)) {
          this_00 = ppvVar11[(long)local_1d8];
          uVar20 = uniform_hash(feature_name.begin,(long)feature_name.end - (long)feature_name.begin
                                ,0x1aa5cfd);
          ppfVar12 = v_hashmap<substring,_features_*>::get(this_00,&feature_name,uVar20);
          pfVar8 = *ppfVar12;
          if (pfVar8 != (features *)0x0) {
            _begin_00 = (pfVar8->values)._begin;
            pfVar15 = (pfVar8->values)._end;
            if (pfVar15 != _begin_00) {
              peVar7 = this->ae;
              if ((peVar7->super_example_predict).feature_space[0x87].values._end ==
                  (peVar7->super_example_predict).feature_space[0x87].values._begin) {
                v_array<unsigned_char>::push_back
                          ((v_array<unsigned_char> *)peVar7,&dictionary_namespace);
                _begin_00 = (pfVar8->values)._begin;
                pfVar15 = (pfVar8->values)._end;
              }
              push_many<float>(&(peVar7->super_example_predict).feature_space[0x87].values,_begin_00
                               ,(long)pfVar15 - (long)_begin_00 >> 2);
              _begin = (pfVar8->indicies)._begin;
              push_many<unsigned_long>
                        (&(peVar7->super_example_predict).feature_space[0x87].indicies,_begin,
                         (long)(pfVar8->indicies)._end - (long)_begin >> 3);
              (peVar7->super_example_predict).feature_space[0x87].sum_feat_sq =
                   pfVar8->sum_feat_sq +
                   (peVar7->super_example_predict).feature_space[0x87].sum_feat_sq;
              local_1d0 = (features *)
                          &(peVar7->super_example_predict).feature_space[0x87].space_names;
              for (uVar18 = 0;
                  uVar18 < (ulong)((long)(pfVar8->indicies)._end - (long)(pfVar8->indicies)._begin
                                  >> 3); uVar18 = uVar18 + 1) {
                std::__cxx11::stringstream::stringstream((stringstream *)&feature_v);
                poVar13 = std::operator<<((ostream *)ppcVar2,this->index);
                std::operator<<(poVar13,'_');
                for (pcVar19 = feature_name.begin; pcVar19 != feature_name.end;
                    pcVar19 = pcVar19 + 1) {
                  std::operator<<((ostream *)ppcVar2,*pcVar19);
                }
                poVar13 = std::operator<<((ostream *)ppcVar2,'=');
                std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
                ppVar9 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)operator_new(0x40);
                std::__cxx11::stringbuf::str();
                std::
                pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::
                pair<const_char_(&)[11],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                          (ppVar9,(char (*) [11])0x2342ba,&local_1f8);
                std::
                __shared_ptr<std::pair<std::__cxx11::string,std::__cxx11::string>,(__gnu_cxx::_Lock_policy)2>
                ::__shared_ptr<std::pair<std::__cxx11::string,std::__cxx11::string>,void>
                          (local_1c8,ppVar9);
                v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::push_back((v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)local_1d0,
                            (shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_1c8);
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1c0);
                std::__cxx11::string::~string((string *)&local_1f8);
                std::__cxx11::stringstream::~stringstream((stringstream *)&feature_v);
              }
            }
          }
          ppvVar11 = this->namespace_dictionaries[this->index].
                     super__Vector_base<v_hashmap<substring,_features_*>_*,_std::allocator<v_hashmap<substring,_features_*>_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          ppvVar14 = this->namespace_dictionaries[this->index].
                     super__Vector_base<v_hashmap<substring,_features_*>_*,_std::allocator<v_hashmap<substring,_features_*>_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
        }
      }
    }
  }
  return;
}

Assistant:

inline void maybeFeature()
  {
    if (*reading_head == ' ' || *reading_head == '\t' || *reading_head == '|' || reading_head == endLine ||
        *reading_head == '\r')
    {
      // maybeFeature --> ø
    }
    else
    {
      // maybeFeature --> 'String' FeatureValue
      substring feature_name = read_name();
      v = cur_channel_v * featureValue();
      uint64_t word_hash;
      if (feature_name.end != feature_name.begin)
        word_hash = (p->hasher(feature_name, channel_hash));
      else
        word_hash = channel_hash + anon++;
      if (v == 0)
        return;  // dont add 0 valued features to list of features
      features& fs = ae->feature_space[index];
      fs.push_back(v, word_hash);
      if (audit)
      {
        v_array<char> feature_v = v_init<char>();
        push_many(feature_v, feature_name.begin, feature_name.end - feature_name.begin);
        feature_v.push_back('\0');
        fs.space_names.push_back(audit_strings_ptr(new audit_strings(base, feature_v.begin())));
        feature_v.delete_v();
      }
      if ((affix_features[index] > 0) && (feature_name.end != feature_name.begin))
      {
        features& affix_fs = ae->feature_space[affix_namespace];
        if (affix_fs.size() == 0)
          ae->indices.push_back(affix_namespace);
        uint64_t affix = affix_features[index];
        while (affix > 0)
        {
          bool is_prefix = affix & 0x1;
          uint64_t len = (affix >> 1) & 0x7;
          substring affix_name = {feature_name.begin, feature_name.end};
          if (affix_name.end > affix_name.begin + len)
          {
            if (is_prefix)
              affix_name.end = affix_name.begin + len;
            else
              affix_name.begin = affix_name.end - len;
          }
          word_hash =
              p->hasher(affix_name, (uint64_t)channel_hash) * (affix_constant + (affix & 0xF) * quadratic_constant);
          affix_fs.push_back(v, word_hash);
          if (audit)
          {
            v_array<char> affix_v = v_init<char>();
            if (index != ' ')
              affix_v.push_back(index);
            affix_v.push_back(is_prefix ? '+' : '-');
            affix_v.push_back('0' + (char)len);
            affix_v.push_back('=');
            push_many(affix_v, affix_name.begin, affix_name.end - affix_name.begin);
            affix_v.push_back('\0');
            affix_fs.space_names.push_back(audit_strings_ptr(new audit_strings("affix", affix_v.begin())));
          }
          affix >>= 4;
        }
      }
      if (spelling_features[index])
      {
        features& spell_fs = ae->feature_space[spelling_namespace];
        if (spell_fs.size() == 0)
          ae->indices.push_back(spelling_namespace);
        // v_array<char> spelling;
        spelling.clear();
        for (char* c = feature_name.begin; c != feature_name.end; ++c)
        {
          char d = 0;
          if ((*c >= '0') && (*c <= '9'))
            d = '0';
          else if ((*c >= 'a') && (*c <= 'z'))
            d = 'a';
          else if ((*c >= 'A') && (*c <= 'Z'))
            d = 'A';
          else if (*c == '.')
            d = '.';
          else
            d = '#';
          // if ((spelling.size() == 0) || (spelling.last() != d))
          spelling.push_back(d);
        }
        substring spelling_ss = {spelling.begin(), spelling.end()};
        uint64_t word_hash = hashstring(spelling_ss, (uint64_t)channel_hash);
        spell_fs.push_back(v, word_hash);
        if (audit)
        {
          v_array<char> spelling_v = v_init<char>();
          if (index != ' ')
          {
            spelling_v.push_back(index);
            spelling_v.push_back('_');
          }
          push_many(spelling_v, spelling_ss.begin, spelling_ss.end - spelling_ss.begin);
          spelling_v.push_back('\0');
          spell_fs.space_names.push_back(audit_strings_ptr(new audit_strings("spelling", spelling_v.begin())));
        }
      }
      if (namespace_dictionaries[index].size() > 0)
      {
        for (size_t dict = 0; dict < namespace_dictionaries[index].size(); dict++)
        {
          feature_dict* map = namespace_dictionaries[index][dict];
          uint64_t hash = uniform_hash(feature_name.begin, feature_name.end - feature_name.begin, quadratic_constant);
          features* feats = map->get(feature_name, hash);
          if ((feats != nullptr) && (feats->values.size() > 0))
          {
            features& dict_fs = ae->feature_space[dictionary_namespace];
            if (dict_fs.size() == 0)
              ae->indices.push_back(dictionary_namespace);
            push_many(dict_fs.values, feats->values.begin(), feats->values.size());
            push_many(dict_fs.indicies, feats->indicies.begin(), feats->indicies.size());
            dict_fs.sum_feat_sq += feats->sum_feat_sq;
            if (audit)
              for (size_t i = 0; i < feats->indicies.size(); ++i)
              {
                uint64_t id = feats->indicies[i];
                stringstream ss;
                ss << index << '_';
                for (char* fc = feature_name.begin; fc != feature_name.end; ++fc) ss << *fc;
                ss << '=' << id;
                dict_fs.space_names.push_back(audit_strings_ptr(new audit_strings("dictionary", ss.str())));
              }
          }
        }
      }
    }
  }